

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<kj::Exception::Detail> * __thiscall
kj::ArrayBuilder<kj::Exception::Detail>::operator=
          (ArrayBuilder<kj::Exception::Detail> *this,ArrayBuilder<kj::Exception::Detail> *other)

{
  Detail *pDVar1;
  RemoveConst<kj::Exception::Detail> *pRVar2;
  Detail *pDVar3;
  ArrayDisposer *pAVar4;
  
  pDVar1 = this->ptr;
  if (pDVar1 != (Detail *)0x0) {
    pRVar2 = this->pos;
    pDVar3 = this->endPtr;
    this->ptr = (Detail *)0x0;
    this->pos = (RemoveConst<kj::Exception::Detail> *)0x0;
    this->endPtr = (Detail *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pDVar1,0x20,(long)pRVar2 - (long)pDVar1 >> 5,
               (long)pDVar3 - (long)pDVar1 >> 5,
               ArrayDisposer::Dispose_<kj::Exception::Detail>::destruct);
  }
  pRVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (Detail *)0x0;
  other->pos = (RemoveConst<kj::Exception::Detail> *)0x0;
  other->endPtr = (Detail *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }